

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::TextureGatherTests::init(TextureGatherTests *this,EVP_PKEY_CTX *ctx)

{
  TextureType textureType;
  CompareMode shadowCompareMode;
  WrapMode wrapS;
  Context *pCVar1;
  uint uVar2;
  TestNode *pTVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined8 extraout_RAX_00;
  TestNode *pTVar4;
  long *plVar5;
  TextureGatherCase *pTVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  TextureFormat TVar8;
  TextureFormat textureFormat;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_02;
  char *description;
  size_type *psVar9;
  ulong *puVar10;
  GatherType gatherType;
  char *pcVar11;
  ChannelOrder CVar12;
  FilterMode FVar13;
  long lVar14;
  TextureFormat TVar15;
  TextureSwizzleComponent comp;
  TextureFormat textureFormat_00;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  OffsetSize offsetSize;
  long lVar19;
  bool bVar20;
  anon_struct_24_2_3f8e1b6f *paVar21;
  CompareMode *pCVar22;
  bool bVar23;
  deUint32 dVar24;
  string caseName_1;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  TextureFormat local_2f0;
  string local_2e8;
  anon_struct_16_2_3ce319a5 *local_2c8;
  TestNode *local_2c0;
  TestNode *local_2b8;
  string local_2b0;
  TestNode *local_290;
  IVec3 *local_288;
  undefined4 local_280;
  uint local_27c;
  TestNode *local_278;
  TestNode *local_270;
  long local_268;
  TestNode *local_260;
  long local_258;
  TestNode *local_250;
  MaybeTextureSwizzle swizzle;
  anon_struct_16_2_3ce319a5 formats [4];
  string caseName;
  ios_base local_178 [272];
  anon_struct_24_2_3f8e1b6f textureSizes [2];
  
  formats[0].name = "rgba8";
  formats[0].format.order = RGBA;
  formats[0].format.type = UNORM_INT8;
  formats[1].name = "rgba8ui";
  formats[1].format.order = RGBA;
  formats[1].format.type = UNSIGNED_INT8;
  formats[2].name = "rgba8i";
  formats[2].format.order = RGBA;
  formats[2].format.type = SIGNED_INT8;
  formats[3].name = "depth32f";
  formats[3].format.order = D;
  formats[3].format.type = FLOAT;
  textureSizes[0].name = "size_pot";
  textureSizes[0].size.m_data[0] = 0x40;
  textureSizes[0].size.m_data[1] = 0x40;
  textureSizes[0].size.m_data[2] = 3;
  textureSizes[1].name = "size_npot";
  textureSizes[1].size.m_data[0] = 0x11;
  textureSizes[1].size.m_data[1] = 0x17;
  textureSizes[1].size.m_data[2] = 3;
  uVar16 = 0;
  do {
    pTVar3 = (TestNode *)operator_new(0x78);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,
               (char *)((long)&DAT_01c88ab8 + (long)(int)(&DAT_01c88ab8)[uVar16]),
               (char *)((long)&DAT_01c88ac8 + (long)(int)(&DAT_01c88ac8)[uVar16]));
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
    local_270 = pTVar3;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    gatherType = GATHERTYPE_BASIC;
    paVar7 = extraout_RAX;
    do {
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT71((int7)((ulong)paVar7 >> 8),uVar16 != 0);
      if ((uVar16 != 0) != (gatherType == GATHERTYPE_BASIC)) {
        local_278 = local_270;
        if (gatherType != GATHERTYPE_BASIC) {
          pTVar3 = (TestNode *)operator_new(0x78);
          pcVar11 = (char *)0x0;
          if (gatherType == GATHERTYPE_OFFSET_DYNAMIC) {
            pcVar11 = "implementation_offset";
          }
          description = (char *)0x0;
          if (gatherType == GATHERTYPE_OFFSET_DYNAMIC) {
            description = "Use offsets within the implementation range";
          }
          if (gatherType == GATHERTYPE_OFFSET) {
            pcVar11 = "min_required_offset";
          }
          pCVar1 = (this->super_TestCaseGroup).m_context;
          if (gatherType == GATHERTYPE_OFFSET) {
            description = "Use offsets within GL minimum required range";
          }
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,pcVar11,description);
          pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
          pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
          local_278 = pTVar3;
          if (pTVar3 != local_270) {
            tcu::TestNode::addChild(local_270,pTVar3);
          }
        }
        lVar14 = 0;
        do {
          textureType = (&DAT_02170168)[lVar14 * 4];
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(ulong)textureType;
          local_258 = lVar14;
          if ((uVar16 == 0) || (textureType != TEXTURETYPE_CUBE)) {
            pTVar3 = (TestNode *)operator_new(0x78);
            pCVar1 = (this->super_TestCaseGroup).m_context;
            tcu::TestCaseGroup::TestCaseGroup
                      ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,
                       *(char **)(&DAT_02170160 + lVar14 * 0x10),
                       ::glcts::fixed_sample_locations_values + 1);
            pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
            pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
            local_260 = pTVar3;
            tcu::TestNode::addChild(local_278,pTVar3);
            lVar14 = 0;
            do {
              uVar17 = (ulong)uVar16;
              local_268 = lVar14;
              pTVar3 = (TestNode *)operator_new(0x78);
              pCVar1 = (this->super_TestCaseGroup).m_context;
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,formats[lVar14].name,
                         ::glcts::fixed_sample_locations_values + 1);
              local_2c8 = formats + lVar14;
              pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
              pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
              local_2c0 = pTVar3;
              tcu::TestNode::addChild(local_260,pTVar3);
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
              do {
                pTVar3 = local_2c0;
                local_2b8 = (TestNode *)0x0;
                local_280 = SUB84(paVar7,0);
                pTVar4 = local_2c0;
                if ((char)paVar7 == '\0') {
                  pTVar4 = (TestNode *)operator_new(0x78);
                  pCVar1 = (this->super_TestCaseGroup).m_context;
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar4,pCVar1->m_testCtx,"no_corners",
                             "Test case variants that don\'t sample around cube map corners");
                  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
                  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
                  local_2b8 = (TestNode *)0x2;
                  if (pTVar3 != pTVar4) {
                    tcu::TestNode::addChild(pTVar3,pTVar4);
                  }
                }
                uVar17 = CONCAT71((int7)(uVar17 >> 8),1);
                paVar21 = textureSizes;
                local_250 = pTVar4;
                do {
                  pTVar3 = local_250;
                  pTVar4 = (TestNode *)operator_new(0x78);
                  pCVar1 = (this->super_TestCaseGroup).m_context;
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar4,pCVar1->m_testCtx,paVar21->name,
                             ::glcts::fixed_sample_locations_values + 1);
                  local_27c = (uint)uVar17;
                  local_288 = &paVar21->size;
                  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
                  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
                  tcu::TestNode::addChild(pTVar3,pTVar4);
                  TVar8.type = SNORM_INT8;
                  TVar8.order = (local_2c8->format).order;
                  TVar15.order = R;
                  TVar15.type = SNORM_INT8;
                  local_290 = pTVar4;
                  do {
                    CVar12 = TVar15.order;
                    if (((TVar8.order - D & 0xfffffffd) == 0) == (CVar12 != R)) {
                      pTVar3 = pTVar4;
                      local_2f0 = TVar15;
                      if (CVar12 != R) {
                        if ((CVar12 != L) && (CVar12 != A)) goto LAB_01623135;
                        pTVar3 = (TestNode *)operator_new(0x78);
                        pCVar1 = (this->super_TestCaseGroup).m_context;
                        local_308 = 0;
                        local_300 = local_300 & 0xffffffffffffff00;
                        local_310 = &local_300;
                        plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
                        caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                        psVar9 = (size_type *)(plVar5 + 2);
                        if ((size_type *)*plVar5 == psVar9) {
                          caseName_1.field_2._M_allocated_capacity = *psVar9;
                          caseName_1.field_2._8_8_ = plVar5[3];
                        }
                        else {
                          caseName_1.field_2._M_allocated_capacity = *psVar9;
                          caseName_1._M_dataplus._M_p = (pointer)*plVar5;
                        }
                        caseName_1._M_string_length = plVar5[1];
                        *plVar5 = (long)psVar9;
                        plVar5[1] = 0;
                        *(undefined1 *)(plVar5 + 2) = 0;
                        plVar5 = (long *)std::__cxx11::string::append((char *)&caseName_1);
                        caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
                        psVar9 = (size_type *)(plVar5 + 2);
                        if ((size_type *)*plVar5 == psVar9) {
                          caseName.field_2._M_allocated_capacity = *psVar9;
                          caseName.field_2._8_8_ = plVar5[3];
                        }
                        else {
                          caseName.field_2._M_allocated_capacity = *psVar9;
                          caseName._M_dataplus._M_p = (pointer)*plVar5;
                        }
                        caseName._M_string_length = plVar5[1];
                        *plVar5 = (long)psVar9;
                        plVar5[1] = 0;
                        *(undefined1 *)(plVar5 + 2) = 0;
                        tcu::TestCaseGroup::TestCaseGroup
                                  ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,
                                   caseName._M_dataplus._M_p,
                                   ::glcts::fixed_sample_locations_values + 1);
                        pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
                        pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName._M_dataplus._M_p != &caseName.field_2) {
                          operator_delete(caseName._M_dataplus._M_p,
                                          caseName.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                          operator_delete(caseName_1._M_dataplus._M_p,
                                          caseName_1.field_2._M_allocated_capacity + 1);
                        }
                        if (local_310 != &local_300) {
                          operator_delete(local_310,local_300 + 1);
                        }
                        if (pTVar3 != pTVar4) {
                          tcu::TestNode::addChild(pTVar4,pTVar3);
                        }
                      }
                      lVar14 = 1;
                      pCVar22 = &DAT_02170198;
                      do {
                        shadowCompareMode = *pCVar22;
                        lVar19 = 0;
                        if (lVar14 != 3) {
                          lVar19 = lVar14;
                        }
                        wrapS = (&DAT_02170198)[lVar19 * 4];
                        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
                        local_2e8._M_string_length = 0;
                        local_2e8.field_2._M_allocated_capacity =
                             local_2e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e8);
                        local_310 = &local_300;
                        puVar10 = (ulong *)(plVar5 + 2);
                        if ((ulong *)*plVar5 == puVar10) {
                          local_300 = *puVar10;
                          lStack_2f8 = plVar5[3];
                        }
                        else {
                          local_300 = *puVar10;
                          local_310 = (ulong *)*plVar5;
                        }
                        local_308 = plVar5[1];
                        *plVar5 = (long)puVar10;
                        plVar5[1] = 0;
                        *(undefined1 *)(plVar5 + 2) = 0;
                        plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
                        caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                        psVar9 = (size_type *)(plVar5 + 2);
                        if ((size_type *)*plVar5 == psVar9) {
                          caseName_1.field_2._M_allocated_capacity = *psVar9;
                          caseName_1.field_2._8_8_ = plVar5[3];
                        }
                        else {
                          caseName_1.field_2._M_allocated_capacity = *psVar9;
                          caseName_1._M_dataplus._M_p = (pointer)*plVar5;
                        }
                        caseName_1._M_string_length = plVar5[1];
                        *plVar5 = (long)psVar9;
                        plVar5[1] = 0;
                        *(undefined1 *)(plVar5 + 2) = 0;
                        dVar24 = 0x1622fc5;
                        plVar5 = (long *)std::__cxx11::string::append((char *)&caseName_1);
                        caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
                        psVar9 = (size_type *)(plVar5 + 2);
                        if ((size_type *)*plVar5 == psVar9) {
                          caseName.field_2._M_allocated_capacity = *psVar9;
                          caseName.field_2._8_8_ = plVar5[3];
                        }
                        else {
                          caseName.field_2._M_allocated_capacity = *psVar9;
                          caseName._M_dataplus._M_p = (pointer)*plVar5;
                        }
                        caseName._M_string_length = plVar5[1];
                        *plVar5 = (long)psVar9;
                        plVar5[1] = 0;
                        *(undefined1 *)(plVar5 + 2) = 0;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                          dVar24 = 0x162303e;
                          operator_delete(caseName_1._M_dataplus._M_p,
                                          caseName_1.field_2._M_allocated_capacity + 1);
                        }
                        if (local_310 != &local_300) {
                          dVar24 = 0x162305a;
                          operator_delete(local_310,local_300 + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                          dVar24 = 0x1623074;
                          operator_delete(local_2e8._M_dataplus._M_p,
                                          local_2e8.field_2._M_allocated_capacity + 1);
                        }
                        TVar15 = local_2f0;
                        TVar8 = local_2c8->format;
                        caseName_1._M_dataplus._M_p = (pointer)0x600000006;
                        caseName_1._M_string_length = 0x600000006;
                        caseName_1.field_2._M_allocated_capacity =
                             caseName_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        pTVar6 = Functional::anon_unknown_0::makeTextureGatherCase
                                           (textureType,(this->super_TestCaseGroup).m_context,
                                            caseName._M_dataplus._M_p,(char *)(ulong)uVar16,
                                            gatherType,TVar8.order,local_2f0,shadowCompareMode,wrapS
                                            ,(WrapMode)&caseName_1,(MaybeTextureSwizzle *)0x0,
                                            NEAREST,NEAREST,(int)local_288,(IVec3 *)local_2b8,dVar24
                                           );
                        tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar6);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName._M_dataplus._M_p != &caseName.field_2) {
                          operator_delete(caseName._M_dataplus._M_p,
                                          caseName.field_2._M_allocated_capacity + 1);
                        }
                        pCVar22 = pCVar22 + 4;
                        lVar14 = lVar14 + 1;
                        pTVar4 = local_290;
                      } while (lVar14 != 4);
                    }
LAB_01623135:
                    TVar15.order = TVar15.order + A;
                    TVar15.type = SNORM_INT8;
                  } while (TVar15.order != 9);
                  paVar21 = textureSizes + 1;
                  uVar17 = 0;
                } while ((local_27c & 1) != 0);
                paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
              } while (((byte)local_280 & textureType == TEXTURETYPE_CUBE) != 0);
              if (gatherType != GATHERTYPE_OFFSET) {
                if ((TVar8.order != D) && (TVar8.order != DS)) {
                  TVar8 = (TextureFormat)operator_new(0x78);
                  pCVar1 = (this->super_TestCaseGroup).m_context;
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)TVar8,pCVar1->m_testCtx,"texture_swizzle",
                             ::glcts::fixed_sample_locations_values + 1);
                  *(undefined ***)TVar8 = &PTR__TestCase_02160970;
                  ((TestNode *)((long)TVar8 + 0x70))->_vptr_TestNode = (_func_int **)pCVar1;
                  tcu::TestNode::addChild(local_2c0,(TestNode *)TVar8);
                  uVar17 = 0;
                  local_2f0 = TVar8;
                  do {
                    swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_R;
                    swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_G;
                    swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_B;
                    swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_A;
                    swizzle.m_isSome = true;
                    caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                    caseName_1._M_string_length = 0;
                    caseName_1.field_2._M_allocated_capacity =
                         caseName_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    uVar18 = uVar17 & 0xffffffff;
                    lVar14 = 0;
                    do {
                      comp = (int)uVar18 + (int)(uVar18 / 6) * -6;
                      swizzle.m_swizzle.m_data[lVar14] = comp;
                      pcVar11 = "";
                      if (lVar14 != 0) {
                        pcVar11 = "_";
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
                      Functional::anon_unknown_0::operator<<((ostream *)&caseName,comp);
                      std::__cxx11::stringbuf::str();
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
                      std::ios_base::~ios_base(local_178);
                      de::toLower(&local_2e8,&local_2b0);
                      plVar5 = (long *)std::__cxx11::string::replace
                                                 ((ulong)&local_2e8,0,(char *)0x0,(ulong)pcVar11);
                      local_310 = &local_300;
                      puVar10 = (ulong *)(plVar5 + 2);
                      if ((ulong *)*plVar5 == puVar10) {
                        local_300 = *puVar10;
                        lStack_2f8 = plVar5[3];
                      }
                      else {
                        local_300 = *puVar10;
                        local_310 = (ulong *)*plVar5;
                      }
                      local_308 = plVar5[1];
                      *plVar5 = (long)puVar10;
                      plVar5[1] = 0;
                      *(undefined1 *)(plVar5 + 2) = 0;
                      dVar24 = 0x1623344;
                      std::__cxx11::string::_M_append((char *)&caseName_1,(ulong)local_310);
                      if (local_310 != &local_300) {
                        dVar24 = 0x1623360;
                        operator_delete(local_310,local_300 + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                        dVar24 = 0x162337a;
                        operator_delete(local_2e8._M_dataplus._M_p,
                                        local_2e8.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                        dVar24 = 0x162339f;
                        operator_delete(local_2b0._M_dataplus._M_p,
                                        CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                                                 local_2b0.field_2._M_local_buf[0]) + 1);
                      }
                      lVar14 = lVar14 + 1;
                      uVar18 = (ulong)((int)uVar18 + 1);
                    } while (lVar14 != 4);
                    TVar8 = local_2c8->format;
                    caseName._M_dataplus._M_p = (pointer)0x4000000040;
                    caseName._M_string_length = CONCAT44(caseName._M_string_length._4_4_,3);
                    pTVar6 = Functional::anon_unknown_0::makeTextureGatherCase
                                       (textureType,(this->super_TestCaseGroup).m_context,
                                        caseName_1._M_dataplus._M_p,(char *)(ulong)uVar16,gatherType
                                        ,TVar8.order,(TextureFormat)0x0,COMPAREMODE_LESS_OR_EQUAL,
                                        REPEAT_GL,(WrapMode)&swizzle,(MaybeTextureSwizzle *)0x0,
                                        NEAREST,NEAREST,(int)&caseName,(IVec3 *)0x0,dVar24);
                    tcu::TestNode::addChild((TestNode *)local_2f0,(TestNode *)pTVar6);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                      operator_delete(caseName_1._M_dataplus._M_p,
                                      caseName_1.field_2._M_allocated_capacity + 1);
                    }
                    uVar17 = uVar17 + 1;
                  } while (uVar17 != 6);
                }
                pTVar3 = (TestNode *)operator_new(0x78);
                pCVar1 = (this->super_TestCaseGroup).m_context;
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"filter_mode",
                           "Test that filter modes have no effect");
                pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
                pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
                local_2b8 = pTVar3;
                tcu::TestNode::addChild(local_2c0,pTVar3);
                uVar17 = (ulong)(local_2c8->format).type;
                pTVar3 = (TestNode *)0x0;
                do {
                  local_288 = (IVec3 *)(&DAT_021701e0 + (long)pTVar3 * 2);
                  local_2f0.type = SNORM_INT8;
                  local_2f0.order = (&DAT_021701e8)[(long)pTVar3 * 4];
                  lVar14 = 0;
                  bVar23 = true;
                  local_290 = pTVar3;
                  do {
                    bVar20 = bVar23;
                    FVar13 = (&DAT_021701c8)[lVar14 * 4];
                    bVar23 = (TVar8.order - D & 0xfffffffd) == 0;
                    uVar2 = (uint)uVar17;
                    if ((uVar2 < 7) && ((0x58U >> (uVar2 & 0x1f) & 1) != 0)) {
                      if (FVar13 != NEAREST) {
LAB_0162353a:
                        if ((uVar2 < 0x22) && ((0x2c0000000U >> (uVar17 & 0x3f) & 1) != 0)) {
                          if ((FVar13 == NEAREST) && (local_2f0.order == I)) {
LAB_01623571:
                            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
                            local_2b0._M_string_length = 0;
                            local_2b0.field_2._M_local_buf[0] = '\0';
                            plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
                            puVar10 = (ulong *)(plVar5 + 2);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*plVar5 ==
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)puVar10) {
                              local_2e8.field_2._M_allocated_capacity = *puVar10;
                              local_2e8.field_2._8_8_ = plVar5[3];
                              local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
                            }
                            else {
                              local_2e8.field_2._M_allocated_capacity = *puVar10;
                              local_2e8._M_dataplus._M_p = (pointer)*plVar5;
                            }
                            local_2e8._M_string_length = plVar5[1];
                            *plVar5 = (long)puVar10;
                            plVar5[1] = 0;
                            *(undefined1 *)(plVar5 + 2) = 0;
                            plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e8);
                            local_310 = &local_300;
                            puVar10 = (ulong *)(plVar5 + 2);
                            if ((ulong *)*plVar5 == puVar10) {
                              local_300 = *puVar10;
                              lStack_2f8 = plVar5[3];
                            }
                            else {
                              local_300 = *puVar10;
                              local_310 = (ulong *)*plVar5;
                            }
                            local_308 = plVar5[1];
                            *plVar5 = (long)puVar10;
                            plVar5[1] = 0;
                            *(undefined1 *)(plVar5 + 2) = 0;
                            plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
                            caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                            psVar9 = (size_type *)(plVar5 + 2);
                            if ((size_type *)*plVar5 == psVar9) {
                              caseName_1.field_2._M_allocated_capacity = *psVar9;
                              caseName_1.field_2._8_8_ = plVar5[3];
                            }
                            else {
                              caseName_1.field_2._M_allocated_capacity = *psVar9;
                              caseName_1._M_dataplus._M_p = (pointer)*plVar5;
                            }
                            caseName_1._M_string_length = plVar5[1];
                            *plVar5 = (long)psVar9;
                            plVar5[1] = 0;
                            *(undefined1 *)(plVar5 + 2) = 0;
                            dVar24 = 0x16236e4;
                            plVar5 = (long *)std::__cxx11::string::append((char *)&caseName_1);
                            caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
                            psVar9 = (size_type *)(plVar5 + 2);
                            if ((size_type *)*plVar5 == psVar9) {
                              caseName.field_2._M_allocated_capacity = *psVar9;
                              caseName.field_2._8_8_ = plVar5[3];
                            }
                            else {
                              caseName.field_2._M_allocated_capacity = *psVar9;
                              caseName._M_dataplus._M_p = (pointer)*plVar5;
                            }
                            caseName._M_string_length = plVar5[1];
                            *plVar5 = (long)psVar9;
                            plVar5[1] = 0;
                            *(undefined1 *)(plVar5 + 2) = 0;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                              dVar24 = 0x1623755;
                              operator_delete(caseName_1._M_dataplus._M_p,
                                              caseName_1.field_2._M_allocated_capacity + 1);
                            }
                            if (local_310 != &local_300) {
                              dVar24 = 0x1623771;
                              operator_delete(local_310,local_300 + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                              dVar24 = 0x162378b;
                              operator_delete(local_2e8._M_dataplus._M_p,
                                              local_2e8.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                              dVar24 = 0x16237b0;
                              operator_delete(local_2b0._M_dataplus._M_p,
                                              CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_
                                                       ,local_2b0.field_2._M_local_buf[0]) + 1);
                            }
                            textureFormat_00._1_7_ = 0;
                            textureFormat_00.order._0_1_ = bVar23;
                            TVar8 = local_2c8->format;
                            caseName_1._M_dataplus._M_p = (pointer)0x600000006;
                            caseName_1._M_string_length = 0x600000006;
                            caseName_1.field_2._M_allocated_capacity =
                                 caseName_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
                            local_310 = (ulong *)0x4000000040;
                            local_308 = CONCAT44(local_308._4_4_,3);
                            pTVar6 = Functional::anon_unknown_0::makeTextureGatherCase
                                               (textureType,(this->super_TestCaseGroup).m_context,
                                                caseName._M_dataplus._M_p,(char *)(ulong)uVar16,
                                                gatherType,TVar8.order,textureFormat_00,
                                                COMPAREMODE_LESS_OR_EQUAL,REPEAT_GL,
                                                (WrapMode)&caseName_1,
                                                (MaybeTextureSwizzle *)local_2f0,FVar13,NEAREST,
                                                (int)&local_310,(IVec3 *)0x0,dVar24);
                            tcu::TestNode::addChild(local_2b8,(TestNode *)pTVar6);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)caseName._M_dataplus._M_p != &caseName.field_2) {
                              operator_delete(caseName._M_dataplus._M_p,
                                              caseName.field_2._M_allocated_capacity + 1);
                            }
                            uVar17 = (ulong)TVar8 >> 0x20;
                          }
                        }
                        else if ((2 < uVar2 - 0x1b) || (local_2f0.order == I && FVar13 == NEAREST))
                        goto LAB_01623571;
                      }
                    }
                    else if (!bVar23 || FVar13 != NEAREST) goto LAB_0162353a;
                    lVar14 = 1;
                    bVar23 = false;
                  } while (bVar20);
                  pTVar3 = (TestNode *)((long)&local_290->_vptr_TestNode + 1);
                } while (pTVar3 != (TestNode *)0x5);
                pTVar3 = (TestNode *)operator_new(0x78);
                pCVar1 = (this->super_TestCaseGroup).m_context;
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"base_level",
                           ::glcts::fixed_sample_locations_values + 1);
                pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
                pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
                tcu::TestNode::addChild(local_2c0,pTVar3);
                FVar13 = LINEAR;
                do {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
                  std::ostream::operator<<(&caseName,FVar13);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
                  std::ios_base::~ios_base(local_178);
                  dVar24 = 0x1623959;
                  plVar5 = (long *)std::__cxx11::string::replace
                                             ((ulong)&local_310,0,(char *)0x0,0x1c66ff0);
                  caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                  psVar9 = (size_type *)(plVar5 + 2);
                  if ((size_type *)*plVar5 == psVar9) {
                    caseName_1.field_2._M_allocated_capacity = *psVar9;
                    caseName_1.field_2._8_8_ = plVar5[3];
                  }
                  else {
                    caseName_1.field_2._M_allocated_capacity = *psVar9;
                    caseName_1._M_dataplus._M_p = (pointer)*plVar5;
                  }
                  caseName_1._M_string_length = plVar5[1];
                  *plVar5 = (long)psVar9;
                  plVar5[1] = 0;
                  *(undefined1 *)(plVar5 + 2) = 0;
                  if (local_310 != &local_300) {
                    dVar24 = 0x16239bb;
                    operator_delete(local_310,local_300 + 1);
                  }
                  textureFormat._1_7_ = 0;
                  textureFormat.order._0_1_ = (TVar8.order - D & 0xfffffffd) == 0;
                  TVar8 = local_2c8->format;
                  caseName._M_dataplus._M_p = (pointer)0x600000006;
                  caseName._M_string_length = 0x600000006;
                  caseName.field_2._M_allocated_capacity =
                       caseName.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  local_310 = (ulong *)0x4000000040;
                  local_308 = CONCAT44(local_308._4_4_,3);
                  offsetSize = TVar8.order;
                  pTVar6 = Functional::anon_unknown_0::makeTextureGatherCase
                                     (textureType,(this->super_TestCaseGroup).m_context,
                                      caseName_1._M_dataplus._M_p,(char *)(ulong)uVar16,gatherType,
                                      offsetSize,textureFormat,COMPAREMODE_LESS_OR_EQUAL,REPEAT_GL,
                                      (WrapMode)&caseName,(MaybeTextureSwizzle *)0x0,NEAREST,FVar13,
                                      (int)&local_310,(IVec3 *)0x0,dVar24);
                  tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar6);
                  paVar7 = &caseName_1.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)caseName_1._M_dataplus._M_p != paVar7) {
                    operator_delete(caseName_1._M_dataplus._M_p,
                                    caseName_1.field_2._M_allocated_capacity + 1);
                    paVar7 = extraout_RAX_01;
                  }
                  FVar13 = FVar13 + LINEAR;
                } while (FVar13 != NEAREST_MIPMAP_LINEAR);
                if ((offsetSize != 0x12) && (offsetSize != 0x14)) {
                  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)((ulong)TVar8 >> 0x20);
                  if ((2 < TVar8.type - SIGNED_INT8) &&
                     ((UNSIGNED_INT32 < TVar8.type ||
                      ((0x2c0000000U >> ((ulong)paVar7 & 0x3f) & 1) == 0)))) {
                    pTVar3 = (TestNode *)operator_new(0x78);
                    pCVar1 = (this->super_TestCaseGroup).m_context;
                    tcu::TestCaseGroup::TestCaseGroup
                              ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"incomplete",
                               "Test that textureGather* takes components from (0,0,0,1) for incomplete textures"
                              );
                    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
                    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
                    dVar24 = 0x1623b1f;
                    tcu::TestNode::addChild(local_2c0,pTVar3);
                    caseName._M_dataplus._M_p = (pointer)0x600000006;
                    caseName._M_string_length = 0x600000006;
                    caseName.field_2._M_allocated_capacity =
                         caseName.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    caseName_1._M_dataplus._M_p = (pointer)0x4000000040;
                    caseName_1._M_string_length = CONCAT44(caseName_1._M_string_length._4_4_,3);
                    pTVar6 = Functional::anon_unknown_0::makeTextureGatherCase
                                       (textureType,(this->super_TestCaseGroup).m_context,
                                        "mipmap_incomplete",(char *)(ulong)uVar16,gatherType,
                                        offsetSize,(TextureFormat)0x0,COMPAREMODE_LESS_OR_EQUAL,
                                        REPEAT_GL,(WrapMode)&caseName,(MaybeTextureSwizzle *)0x2,
                                        NEAREST,NEAREST,(int)&caseName_1,(IVec3 *)&DAT_00000001,
                                        dVar24);
                    tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar6);
                    paVar7 = extraout_RAX_02;
                  }
                }
              }
              lVar14 = local_268 + 1;
            } while (lVar14 != 4);
          }
          lVar14 = local_258 + 1;
        } while (lVar14 != 3);
      }
      gatherType = gatherType + GATHERTYPE_OFFSET;
    } while (gatherType != GATHERTYPE_OFFSETS);
    uVar16 = uVar16 + 1;
    if (uVar16 == 4) {
      return (int)paVar7;
    }
  } while( true );
}

Assistant:

void TextureGatherTests::init (void)
{
	const struct
	{
		const char* name;
		TextureType type;
	} textureTypes[] =
	{
		{ "2d",			TEXTURETYPE_2D			},
		{ "2d_array",	TEXTURETYPE_2D_ARRAY	},
		{ "cube",		TEXTURETYPE_CUBE		}
	};

	const struct
	{
		const char*			name;
		tcu::TextureFormat	format;
	} formats[] =
	{
		{ "rgba8",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8)		},
		{ "rgba8ui",	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8)	},
		{ "rgba8i",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8)	},
		{ "depth32f",	tcu::TextureFormat(tcu::TextureFormat::D,		tcu::TextureFormat::FLOAT)			}
	};

	const struct
	{
		const char*		name;
		IVec3			size;
	} textureSizes[] =
	{
		{ "size_pot",	IVec3(64, 64, 3) },
		{ "size_npot",	IVec3(17, 23, 3) }
	};

	const struct
	{
		const char*				name;
		tcu::Sampler::WrapMode	mode;
	} wrapModes[] =
	{
		{ "clamp_to_edge",		tcu::Sampler::CLAMP_TO_EDGE			},
		{ "repeat",				tcu::Sampler::REPEAT_GL				},
		{ "mirrored_repeat",	tcu::Sampler::MIRRORED_REPEAT_GL	}
	};

	for (int gatherTypeI = 0; gatherTypeI < GATHERTYPE_LAST; gatherTypeI++)
	{
		const GatherType		gatherType			= (GatherType)gatherTypeI;
		TestCaseGroup* const	gatherTypeGroup		= new TestCaseGroup(m_context, gatherTypeName(gatherType), gatherTypeDescription(gatherType));
		addChild(gatherTypeGroup);

		for (int offsetSizeI = 0; offsetSizeI < OFFSETSIZE_LAST; offsetSizeI++)
		{
			const OffsetSize offsetSize = (OffsetSize)offsetSizeI;
			if ((gatherType == GATHERTYPE_BASIC) != (offsetSize == OFFSETSIZE_NONE))
				continue;

			TestCaseGroup* const offsetSizeGroup = offsetSize == OFFSETSIZE_NONE ?
													gatherTypeGroup :
													new TestCaseGroup(m_context,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "min_required_offset"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "implementation_offset"
																	  : DE_NULL,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "Use offsets within GL minimum required range"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "Use offsets within the implementation range"
																	  : DE_NULL);
			if (offsetSizeGroup != gatherTypeGroup)
				gatherTypeGroup->addChild(offsetSizeGroup);

			for (int textureTypeNdx = 0; textureTypeNdx < DE_LENGTH_OF_ARRAY(textureTypes); textureTypeNdx++)
			{
				const TextureType textureType = textureTypes[textureTypeNdx].type;

				if (textureType == TEXTURETYPE_CUBE && gatherType != GATHERTYPE_BASIC)
					continue;

				TestCaseGroup* const textureTypeGroup = new TestCaseGroup(m_context, textureTypes[textureTypeNdx].name, "");
				offsetSizeGroup->addChild(textureTypeGroup);

				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const tcu::TextureFormat&	format			= formats[formatNdx].format;
					TestCaseGroup* const		formatGroup		= new TestCaseGroup(m_context, formats[formatNdx].name, "");
					textureTypeGroup->addChild(formatGroup);

					for (int noCornersI = 0; noCornersI <= ((textureType == TEXTURETYPE_CUBE)?1:0); noCornersI++)
					{
						const bool				noCorners		= noCornersI!= 0;
						TestCaseGroup* const	cornersGroup	= noCorners
																? new TestCaseGroup(m_context, "no_corners", "Test case variants that don't sample around cube map corners")
																: formatGroup;

						if (formatGroup != cornersGroup)
							formatGroup->addChild(cornersGroup);

						for (int textureSizeNdx = 0; textureSizeNdx < DE_LENGTH_OF_ARRAY(textureSizes); textureSizeNdx++)
						{
							const IVec3&			textureSize			= textureSizes[textureSizeNdx].size;
							TestCaseGroup* const	textureSizeGroup	= new TestCaseGroup(m_context, textureSizes[textureSizeNdx].name, "");
							cornersGroup->addChild(textureSizeGroup);

							for (int compareModeI = 0; compareModeI < tcu::Sampler::COMPAREMODE_LAST; compareModeI++)
							{
								const tcu::Sampler::CompareMode compareMode = (tcu::Sampler::CompareMode)compareModeI;

								if ((compareMode != tcu::Sampler::COMPAREMODE_NONE) != isDepthFormat(format))
									continue;

								if (compareMode != tcu::Sampler::COMPAREMODE_NONE &&
									compareMode != tcu::Sampler::COMPAREMODE_LESS &&
									compareMode != tcu::Sampler::COMPAREMODE_GREATER)
									continue;

								TestCaseGroup* const compareModeGroup = compareMode == tcu::Sampler::COMPAREMODE_NONE ?
																			textureSizeGroup :
																			new TestCaseGroup(m_context,
																							  (string() + "compare_" + compareModeName(compareMode)).c_str(),
																							  "");
								if (compareModeGroup != textureSizeGroup)
									textureSizeGroup->addChild(compareModeGroup);

								for (int wrapCaseNdx = 0; wrapCaseNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapCaseNdx++)
								{
									const int						wrapSNdx	= wrapCaseNdx;
									const int						wrapTNdx	= (wrapCaseNdx + 1) % DE_LENGTH_OF_ARRAY(wrapModes);
									const tcu::Sampler::WrapMode	wrapS		= wrapModes[wrapSNdx].mode;
									const tcu::Sampler::WrapMode	wrapT		= wrapModes[wrapTNdx].mode;

									const string caseName = string() + wrapModes[wrapSNdx].name + "_" + wrapModes[wrapTNdx].name;

									compareModeGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format, compareMode, wrapS, wrapT,
																					 MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, textureSize,
																					 noCorners ? GATHERCASE_DONT_SAMPLE_CUBE_CORNERS : 0));
								}
							}
						}
					}

					if (offsetSize != OFFSETSIZE_MINIMUM_REQUIRED) // Don't test all features for both offset size types, as they should be rather orthogonal.
					{
						if (!isDepthFormat(format))
						{
							TestCaseGroup* const swizzleGroup = new TestCaseGroup(m_context, "texture_swizzle", "");
							formatGroup->addChild(swizzleGroup);

							DE_STATIC_ASSERT(TEXTURESWIZZLECOMPONENT_R == 0);
							for (int swizzleCaseNdx = 0; swizzleCaseNdx < TEXTURESWIZZLECOMPONENT_LAST; swizzleCaseNdx++)
							{
								MaybeTextureSwizzle	swizzle	= MaybeTextureSwizzle::createSomeTextureSwizzle();
								string				caseName;

								for (int i = 0; i < 4; i++)
								{
									swizzle.getSwizzle()[i] = (TextureSwizzleComponent)((swizzleCaseNdx + i) % (int)TEXTURESWIZZLECOMPONENT_LAST);
									caseName += (i > 0 ? "_" : "") + de::toLower(de::toString(swizzle.getSwizzle()[i]));
								}

								swizzleGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format,
																			 tcu::Sampler::COMPAREMODE_NONE, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			 swizzle, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, IVec3(64, 64, 3)));
							}
						}

						{
							TestCaseGroup* const filterModeGroup = new TestCaseGroup(m_context, "filter_mode", "Test that filter modes have no effect");
							formatGroup->addChild(filterModeGroup);

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} magFilters[] =
							{
								{ "linear",		tcu::Sampler::LINEAR	},
								{ "nearest",	tcu::Sampler::NEAREST	}
							};

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} minFilters[] =
							{
								// \note Don't test NEAREST here, as it's covered by other cases.
								{ "linear",						tcu::Sampler::LINEAR					},
								{ "nearest_mipmap_nearest",		tcu::Sampler::NEAREST_MIPMAP_NEAREST	},
								{ "nearest_mipmap_linear",		tcu::Sampler::NEAREST_MIPMAP_LINEAR		},
								{ "linear_mipmap_nearest",		tcu::Sampler::LINEAR_MIPMAP_NEAREST		},
								{ "linear_mipmap_linear",		tcu::Sampler::LINEAR_MIPMAP_LINEAR		},
							};

							for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilters); minFilterNdx++)
							for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
							{
								const tcu::Sampler::FilterMode		minFilter		= minFilters[minFilterNdx].filter;
								const tcu::Sampler::FilterMode		magFilter		= magFilters[magFilterNdx].filter;
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;

								if ((isUnormFormatType(format.type) || isDepthFormat(format)) && magFilter == tcu::Sampler::NEAREST)
									continue; // Covered by other cases.
								if ((isUIntFormatType(format.type) || isSIntFormatType(format.type)) &&
									(magFilter != tcu::Sampler::NEAREST || minFilter != tcu::Sampler::NEAREST_MIPMAP_NEAREST))
									continue;

								const string caseName = string() + "min_" + minFilters[minFilterNdx].name + "_mag_" + magFilters[magFilterNdx].name;

								filterModeGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format, compareMode,
																				tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, MaybeTextureSwizzle::createNoneTextureSwizzle(),
																				minFilter, magFilter, 0, IVec3(64, 64, 3)));
							}
						}

						{
							TestCaseGroup* const baseLevelGroup = new TestCaseGroup(m_context, "base_level", "");
							formatGroup->addChild(baseLevelGroup);

							for (int baseLevel = 1; baseLevel <= 2; baseLevel++)
							{
								const string						caseName		= "level_" + de::toString(baseLevel);
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;
								baseLevelGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format,
																			   compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			   MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST,
																			   baseLevel, IVec3(64, 64, 3)));
							}
						}

						// What shadow textures should return for incomplete textures is unclear.
						// Integer and unsigned integer lookups from incomplete textures return undefined values.
						if (!isDepthFormat(format) && !isSIntFormatType(format.type) && !isUIntFormatType(format.type))
						{
							TestCaseGroup* const incompleteGroup = new TestCaseGroup(m_context, "incomplete", "Test that textureGather* takes components from (0,0,0,1) for incomplete textures");
							formatGroup->addChild(incompleteGroup);

							const tcu::Sampler::CompareMode compareMode = isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;
							incompleteGroup->addChild(makeTextureGatherCase(textureType, m_context, "mipmap_incomplete", "", gatherType, offsetSize, format,
																			compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST_MIPMAP_NEAREST, tcu::Sampler::NEAREST,
																			0, IVec3(64, 64, 3), GATHERCASE_MIPMAP_INCOMPLETE));
						}
					}
				}
			}
		}
	}
}